

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrppm.c
# Opt level: O3

void copy_pixel_rows(j_decompress_ptr cinfo,djpeg_dest_ptr dinfo,JDIMENSION rows_supplied)

{
  memcpy(dinfo[1].start_output,*dinfo->buffer,(ulong)*(uint *)&dinfo[1].calc_buffer_dimensions);
  fwrite(dinfo[1].start_output,1,(size_t)dinfo[1].finish_output,(FILE *)dinfo->output_file);
  return;
}

Assistant:

METHODDEF(void)
copy_pixel_rows(j_decompress_ptr cinfo, djpeg_dest_ptr dinfo,
                JDIMENSION rows_supplied)
{
  ppm_dest_ptr dest = (ppm_dest_ptr)dinfo;
  register char *bufferptr;
  register JSAMPROW ptr;
#if BITS_IN_JSAMPLE != 8
  register JDIMENSION col;
#endif

  ptr = dest->pub.buffer[0];
  bufferptr = dest->iobuffer;
#if BITS_IN_JSAMPLE == 8
  MEMCOPY(bufferptr, ptr, dest->samples_per_row);
#else
  for (col = dest->samples_per_row; col > 0; col--) {
    PUTPPMSAMPLE(bufferptr, *ptr++);
  }
#endif
  (void)JFWRITE(dest->pub.output_file, dest->iobuffer, dest->buffer_width);
}